

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_sse_blend_popcnt_unroll4(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  __m128i input2;
  __m128i input1;
  __m128i input0;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  size_t i;
  uint32_t n_cycles;
  __m128i *data_vectors;
  undefined4 local_590;
  undefined4 local_58c;
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined4 local_53c;
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined8 local_4b8;
  int j;
  int i_2;
  __m128i input1_1;
  __m128i input0_1;
  __m128i v1_1;
  __m128i v0_1;
  int i_1;
  __m128i input3;
  
  for (local_4b8 = 0; local_4b8 + 4 <= (ulong)(in_ESI >> 3); local_4b8 = local_4b8 + 4) {
    pauVar5 = (undefined1 (*) [16])(in_RDI + local_4b8 * 0x10);
    pauVar1 = (undefined1 (*) [16])(in_RDI + 0x10 + local_4b8 * 0x10);
    pauVar6 = (undefined1 (*) [16])(in_RDI + 0x20 + local_4b8 * 0x10);
    pauVar2 = (undefined1 (*) [16])(in_RDI + 0x30 + local_4b8 * 0x10);
    auVar3 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar3 = vpinsrw_avx(auVar3,0xff,2);
    auVar3 = vpinsrw_avx(auVar3,0xff,3);
    auVar3 = vpinsrw_avx(auVar3,0xff,4);
    auVar3 = vpinsrw_avx(auVar3,0xff,5);
    auVar3 = vpinsrw_avx(auVar3,0xff,6);
    auVar3 = vpinsrw_avx(auVar3,0xff,7);
    auVar3 = vpand_avx(*pauVar5,auVar3);
    auVar4 = vpsllw_avx(*pauVar1,ZEXT416(8));
    local_508 = vpor_avx(auVar3,auVar4);
    auVar3 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar3 = vpinsrw_avx(auVar3,0xff00,2);
    auVar3 = vpinsrw_avx(auVar3,0xff00,3);
    auVar3 = vpinsrw_avx(auVar3,0xff00,4);
    auVar3 = vpinsrw_avx(auVar3,0xff00,5);
    auVar3 = vpinsrw_avx(auVar3,0xff00,6);
    auVar3 = vpinsrw_avx(auVar3,0xff00,7);
    auVar3 = vpand_avx(*pauVar5,auVar3);
    auVar4 = vpsrlw_avx(*pauVar1,ZEXT416(8));
    local_518 = vpor_avx(auVar3,auVar4);
    auVar3 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar3 = vpinsrw_avx(auVar3,0xff,2);
    auVar3 = vpinsrw_avx(auVar3,0xff,3);
    auVar3 = vpinsrw_avx(auVar3,0xff,4);
    auVar3 = vpinsrw_avx(auVar3,0xff,5);
    auVar3 = vpinsrw_avx(auVar3,0xff,6);
    auVar3 = vpinsrw_avx(auVar3,0xff,7);
    auVar3 = vpand_avx(*pauVar6,auVar3);
    auVar4 = vpsllw_avx(*pauVar2,ZEXT416(8));
    local_528 = vpor_avx(auVar3,auVar4);
    auVar3 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar3 = vpinsrw_avx(auVar3,0xff00,2);
    auVar3 = vpinsrw_avx(auVar3,0xff00,3);
    auVar3 = vpinsrw_avx(auVar3,0xff00,4);
    auVar3 = vpinsrw_avx(auVar3,0xff00,5);
    auVar3 = vpinsrw_avx(auVar3,0xff00,6);
    auVar3 = vpinsrw_avx(auVar3,0xff00,7);
    auVar3 = vpand_avx(*pauVar6,auVar3);
    auVar4 = vpsrlw_avx(*pauVar2,ZEXT416(8));
    local_538 = vpor_avx(auVar3,auVar4);
    for (local_53c = 0; local_53c < 8; local_53c = local_53c + 1) {
      *(int *)(in_RDX + (long)(7 - local_53c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_508 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_508 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_508 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_508 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_508 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_508 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_508 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_508 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_508 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_508 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_508 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_508 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_508 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_508 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_508 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_508[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_53c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_53c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_518 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_518 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_518 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_518 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_518 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_518 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_518 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_518 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_518 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_518 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_518 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_518 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_518 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_518 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_518 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_518[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_53c) * 4);
      *(int *)(in_RDX + (long)(7 - local_53c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_528 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_528 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_528 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_528 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_528 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_528 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_528 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_528 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_528 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_528 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_528 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_528 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_528 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_528 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_528 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_528[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_53c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_53c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_538 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_538 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_538 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_538 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_538 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_538 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_538 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_538 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_538 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_538 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_538 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_538 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_538 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_538 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_538 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_538[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_53c) * 4);
      local_508 = vpaddb_avx(local_508,local_508);
      local_518 = vpaddb_avx(local_518,local_518);
      local_528 = vpaddb_avx(local_528,local_528);
      local_538 = vpaddb_avx(local_538,local_538);
    }
  }
  for (; local_4b8 + 2 <= (ulong)(in_ESI >> 3); local_4b8 = local_4b8 + 2) {
    pauVar6 = (undefined1 (*) [16])(in_RDI + local_4b8 * 0x10);
    pauVar1 = (undefined1 (*) [16])(in_RDI + 0x10 + local_4b8 * 0x10);
    auVar3 = vpinsrw_avx(ZEXT216(0xff),0xff,1);
    auVar3 = vpinsrw_avx(auVar3,0xff,2);
    auVar3 = vpinsrw_avx(auVar3,0xff,3);
    auVar3 = vpinsrw_avx(auVar3,0xff,4);
    auVar3 = vpinsrw_avx(auVar3,0xff,5);
    auVar3 = vpinsrw_avx(auVar3,0xff,6);
    auVar3 = vpinsrw_avx(auVar3,0xff,7);
    auVar3 = vpand_avx(*pauVar6,auVar3);
    auVar4 = vpsllw_avx(*pauVar1,ZEXT416(8));
    local_578 = vpor_avx(auVar3,auVar4);
    auVar3 = vpinsrw_avx(ZEXT216(0xff00),0xff00,1);
    auVar3 = vpinsrw_avx(auVar3,0xff00,2);
    auVar3 = vpinsrw_avx(auVar3,0xff00,3);
    auVar3 = vpinsrw_avx(auVar3,0xff00,4);
    auVar3 = vpinsrw_avx(auVar3,0xff00,5);
    auVar3 = vpinsrw_avx(auVar3,0xff00,6);
    auVar3 = vpinsrw_avx(auVar3,0xff00,7);
    auVar3 = vpand_avx(*pauVar6,auVar3);
    auVar4 = vpsrlw_avx(*pauVar1,ZEXT416(8));
    local_588 = vpor_avx(auVar3,auVar4);
    for (local_58c = 0; local_58c < 8; local_58c = local_58c + 1) {
      *(int *)(in_RDX + (long)(7 - local_58c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_578 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_578 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_578 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_578 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_578 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_578 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_578 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_578 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_578 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_578 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_578 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_578 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_578 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_578 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_578 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_578[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(7 - local_58c) * 4);
      *(int *)(in_RDX + (long)(0xf - local_58c) * 4) =
           POPCOUNT((uint)(ushort)((ushort)(SUB161(local_588 >> 7,0) & 1) |
                                   (ushort)(SUB161(local_588 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(local_588 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(local_588 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(local_588 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(local_588 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(local_588 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(local_588 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(local_588 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(local_588 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(local_588 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(local_588 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(local_588 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(local_588 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(local_588 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(local_588[0xf] >> 7) << 0xf)) +
           *(int *)(in_RDX + (long)(0xf - local_58c) * 4);
      local_578 = vpaddb_avx(local_578,local_578);
      local_588 = vpaddb_avx(local_588,local_588);
    }
  }
  for (local_4b8 = local_4b8 << 3; local_4b8 < in_ESI; local_4b8 = local_4b8 + 1) {
    for (local_590 = 0; local_590 < 0x10; local_590 = local_590 + 1) {
      *(int *)(in_RDX + (long)local_590 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_4b8 * 2) & 1 << ((byte)local_590 & 0x1f)) >>
           ((byte)local_590 & 0x1f)) + *(int *)(in_RDX + (long)local_590 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_blend_popcnt_unroll4(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m128i* data_vectors = (const __m128i*)(array);
    const uint32_t n_cycles = len / 8;

    size_t i = 0;
    for (/**/; i + 4 <= n_cycles; i += 4) {
#define L(p) __m128i v##p =  _mm_loadu_si128(data_vectors+i+p);
        L(0) L(1) L(2) L(3)

#define U0(p,k) __m128i input##p = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16(0x00FF)), _mm_slli_epi16(v##k, 8));
#define U1(p,k) __m128i input##k = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16((int16_t)0xFF00)), _mm_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3)

#define P0(p) input##p = _mm_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 8;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}